

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONBuildPresets.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::BuildPresetsHelper
               (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::BuildPreset> *in_RCX;
  code *local_80 [2];
  code *local_70;
  code *local_68;
  Object<cmCMakePresetsGraph::BuildPreset> local_60;
  
  if (BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      local_80[1] = (code *)0x0;
      local_80[0] = cmCMakePresetsErrors::INVALID_PRESETS;
      local_68 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::Object
                (&local_60,
                 (Object<cmCMakePresetsGraph::BuildPreset> *)
                 (anonymous_namespace)::BuildPresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::BuildPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>>
                (&BuildPresetsHelper::helper,(cmJSONHelperBuilder *)local_80,
                 (ErrorGenerator *)&local_60,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::~Object(&local_60);
      std::_Function_base::~_Function_base((_Function_base *)local_80);
      __cxa_atexit(std::_Function_base::~_Function_base,&BuildPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&BuildPresetsHelper::helper,out,value,state);
  return bVar1;
}

Assistant:

bool BuildPresetsHelper(std::vector<BuildPreset>& out,
                        const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<BuildPreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, BuildPresetHelper);

  return helper(out, value, state);
}